

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O0

float stb_perlin_fbm_noise3(float x,float y,float z,float lacunarity,float gain,int octaves)

{
  float fVar1;
  undefined4 local_30;
  undefined4 local_2c;
  float sum;
  float amplitude;
  float frequency;
  int i;
  int octaves_local;
  float gain_local;
  float lacunarity_local;
  float z_local;
  float y_local;
  float x_local;
  
  sum = 1.0;
  local_2c = 1.0;
  local_30 = 0.0;
  for (amplitude = 0.0; (int)amplitude < octaves; amplitude = (float)((int)amplitude + 1)) {
    fVar1 = stb_perlin_noise3_internal(x * sum,y * sum,z * sum,0,0,0,SUB41(amplitude,0));
    local_30 = fVar1 * local_2c + local_30;
    sum = lacunarity * sum;
    local_2c = gain * local_2c;
  }
  return local_30;
}

Assistant:

float stb_perlin_fbm_noise3(float x, float y, float z, float lacunarity, float gain, int octaves)
{
   int i;
   float frequency = 1.0f;
   float amplitude = 1.0f;
   float sum = 0.0f;

   for (i = 0; i < octaves; i++) {
      sum += stb_perlin_noise3_internal(x*frequency,y*frequency,z*frequency,0,0,0,(unsigned char)i)*amplitude;
      frequency *= lacunarity;
      amplitude *= gain;
   }
   return sum;
}